

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseName.cpp
# Opt level: O0

int __thiscall DatabaseName::derive(DatabaseName *this,EVP_PKEY_CTX *ctx,uchar *key,size_t *keylen)

{
  string local_d0 [8];
  path *in_stack_ffffffffffffff38;
  path *in_stack_ffffffffffffff40;
  string local_b0 [16];
  string *in_stack_ffffffffffffff60;
  string *in_stack_ffffffffffffff68;
  string *in_stack_ffffffffffffff70;
  path *in_stack_ffffffffffffff78;
  DatabaseName *in_stack_ffffffffffffff80;
  
  std::experimental::filesystem::v1::__cxx11::path::path
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  std::__cxx11::string::string((string *)&stack0xffffffffffffff80,(string *)key);
  std::__cxx11::string::string(local_b0,(string *)(ctx + 0x60));
  std::__cxx11::string::string(local_d0,(string *)keylen);
  DatabaseName(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
               in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  std::__cxx11::string::~string(local_d0);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
  std::experimental::filesystem::v1::__cxx11::path::~path(&this->db_base);
  return (int)this;
}

Assistant:

DatabaseName DatabaseName::derive(const std::string &new_type,
                                  const std::string &new_filename) const {
    return DatabaseName(db_base, new_type, id, new_filename);
}